

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::AnimatedLightNode::get(AnimatedLightNode *this,float time)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  Ref<embree::SceneGraph::LightNode> light1;
  Ref<embree::SceneGraph::LightNode> light0;
  long *local_38;
  long *local_30;
  
  fVar5 = (time - *(float *)(in_RSI + 0x80)) /
          (*(float *)(in_RSI + 0x84) - *(float *)(in_RSI + 0x80));
  fVar6 = floorf(fVar5);
  lVar1 = *(long *)(in_RSI + 0x68);
  lVar4 = *(long *)(in_RSI + 0x70) - lVar1 >> 3;
  fVar6 = (fVar5 - fVar6) * (float)(lVar4 - 1);
  fVar5 = floorf(fVar6);
  iVar2 = 0;
  if (0 < (int)fVar5) {
    iVar2 = (int)fVar5;
  }
  iVar3 = (int)lVar4 + -2;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  (**(code **)(**(long **)(lVar1 + (long)iVar3 * 8) + 0x90))(fVar6,&local_30);
  (**(code **)(**(long **)(*(long *)(in_RSI + 0x68) + 8 + (long)iVar3 * 8) + 0x90))(fVar6,&local_38)
  ;
  (**(code **)(*local_30 + 0x88))(fVar6 - (float)iVar3,this,local_30,&local_38);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x18))();
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> get(float time) const
      {
        time = frac((time-time_range.lower)/time_range.size());
        time = (lights.size()-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)lights.size()-2);
        float ftime = time - (float)itime;
        Ref<LightNode> light0 = lights[itime+0]->get(time);
        Ref<LightNode> light1 = lights[itime+1]->get(time);
        return light0->lerp(light1,ftime);
      }